

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O0

bool loadSphereProgram(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *program_00;
  char *pcVar3;
  char local_428 [8];
  char buf [1024];
  GLuint *program;
  djg_program *djp;
  
  program_00 = djgp_create();
  fprintf(_stdout,"Loading {Sphere-Program}\n");
  fflush(_stdout);
  if (g_sphere.shading.brdf == 0) {
    djgp_push_string(program_00,"#define BRDF_DIFFUSE 1\n");
  }
  else if (g_sphere.shading.brdf == 1) {
    djgp_push_string(program_00,"#define BRDF_MERL 1\n");
  }
  else if (g_sphere.shading.brdf == 2) {
    djgp_push_string(program_00,"#define BRDF_NPF 1\n");
  }
  switch(g_sphere.shading.mode) {
  case 0:
    djgp_push_string(program_00,"#define SHADE_MC_COS 1\n");
    break;
  case 1:
    djgp_push_string(program_00,"#define SHADE_MC_GGX 1\n");
    break;
  case 2:
    djgp_push_string(program_00,"#define SHADE_MC_MIS 1\n");
    break;
  case 3:
    djgp_push_string(program_00,"#define SHADE_DEBUG 1\n");
  }
  djgp_push_string(program_00,"#define BUFFER_BINDING_RANDOM %i\n",2);
  djgp_push_string(program_00,"#define BUFFER_BINDING_TRANSFORMS %i\n",1);
  djgp_push_string(program_00,"#define BUFFER_BINDING_SPHERES %i\n",0);
  pcVar3 = strcat2(local_428,g_app.dir.shader,"ggx.glsl");
  djgp_push_file(program_00,pcVar3);
  pcVar3 = strcat2(local_428,g_app.dir.shader,"npf.glsl");
  djgp_push_file(program_00,pcVar3);
  pcVar3 = strcat2(local_428,g_app.dir.shader,"brdf_merl.glsl");
  djgp_push_file(program_00,pcVar3);
  pcVar3 = strcat2(local_428,g_app.dir.shader,"pivot.glsl");
  djgp_push_file(program_00,pcVar3);
  pcVar3 = strcat2(local_428,g_app.dir.shader,"sphere.glsl");
  djgp_push_file(program_00,pcVar3);
  bVar1 = djgp_to_gl(program_00,0x1ae,false,true,g_gl.programs + 2);
  if (bVar1) {
    djgp_release(program_00);
    g_gl.uniforms[6] = (*glad_glGetUniformLocation)(g_gl.programs[2],"u_SamplesPerPass");
    g_gl.uniforms[7] = (*glad_glGetUniformLocation)(g_gl.programs[2],"u_NpfSampler");
    g_gl.uniforms[8] = (*glad_glGetUniformLocation)(g_gl.programs[2],"u_EnvmapSampler");
    g_gl.uniforms[9] = (*glad_glGetUniformLocation)(g_gl.programs[2],"u_MerlSampler");
    g_gl.uniforms[10] = (*glad_glGetUniformLocation)(g_gl.programs[2],"u_Alpha");
    g_gl.uniforms[0xb] = (*glad_glGetUniformLocation)(g_gl.programs[2],"u_MerlId");
    configureSphereProgram();
    GVar2 = (*glad_glGetError)();
    djp._7_1_ = GVar2 == 0;
  }
  else {
    fprintf(_stdout,"=> Failure <=\n");
    fflush(_stdout);
    djgp_release(program_00);
    djp._7_1_ = false;
  }
  return djp._7_1_;
}

Assistant:

bool loadSphereProgram()
{
    djg_program *djp = djgp_create();
    GLuint *program = &g_gl.programs[PROGRAM_SPHERE];
    char buf[1024];

    LOG("Loading {Sphere-Program}\n");
    switch (g_sphere.shading.brdf) {
        case BRDF_MERL:
            djgp_push_string(djp, "#define BRDF_MERL 1\n");
            break;
        case BRDF_NPF:
            djgp_push_string(djp, "#define BRDF_NPF 1\n");
            break;
        case BRDF_DIFFUSE:
            djgp_push_string(djp, "#define BRDF_DIFFUSE 1\n");
            break;
    };
    switch (g_sphere.shading.mode) {
        case SHADING_DEBUG:
            djgp_push_string(djp, "#define SHADE_DEBUG 1\n");
            break;
        case SHADING_MC_GGX:
            djgp_push_string(djp, "#define SHADE_MC_GGX 1\n");
            break;
        case SHADING_MC_COS:
            djgp_push_string(djp, "#define SHADE_MC_COS 1\n");
            break;
        case SHADING_MC_MIS:
            djgp_push_string(djp, "#define SHADE_MC_MIS 1\n");
            break;
    };
    djgp_push_string(djp, "#define BUFFER_BINDING_RANDOM %i\n", STREAM_RANDOM);
    djgp_push_string(djp, "#define BUFFER_BINDING_TRANSFORMS %i\n", STREAM_TRANSFORM);
    djgp_push_string(djp, "#define BUFFER_BINDING_SPHERES %i\n", STREAM_SPHERES);
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "ggx.glsl"));
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "npf.glsl"));
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "brdf_merl.glsl"));
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "pivot.glsl"));
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "sphere.glsl"));

    if (!djgp_to_gl(djp, 430, false, true, program)) {
        LOG("=> Failure <=\n");
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    g_gl.uniforms[UNIFORM_SPHERE_SAMPLES_PER_PASS] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SPHERE], "u_SamplesPerPass");
    g_gl.uniforms[UNIFORM_SPHERE_NPF_SAMPLER] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SPHERE], "u_NpfSampler");
    g_gl.uniforms[UNIFORM_SPHERE_ENVMAP_SAMPLER] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SPHERE], "u_EnvmapSampler");
    g_gl.uniforms[UNIFORM_SPHERE_MERL_SAMPLER] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SPHERE], "u_MerlSampler");
    g_gl.uniforms[UNIFORM_SPHERE_ALPHA] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SPHERE], "u_Alpha");
    g_gl.uniforms[UNIFORM_SPHERE_MERL_ID] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SPHERE], "u_MerlId");

    configureSphereProgram();

    return (glGetError() == GL_NO_ERROR);
}